

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::init
          (MutableRenderBufferTest *this,EVP_PKEY_CTX *ctx)

{
  NativeDisplay *pNVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  Library *egl;
  EGLDisplay display;
  EGLConfig pvVar5;
  NativeWindowFactory *pNVar6;
  undefined4 extraout_var;
  EGLSurface pvVar7;
  undefined4 extraout_var_00;
  TestError *this_00;
  NotSupportedError *this_01;
  pointer ppvVar8;
  pointer_____offset_0x10___ *ppuVar9;
  EGLint surfaceType;
  EGLint contextAttribList [3];
  EGLint attribs [13];
  EGLint attribsNoBit [13];
  vector<void_*,_std::allocator<void_*>_> local_c8;
  EGLDisplay local_b0;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  EGLint local_68 [14];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = display;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"EGL_KHR_mutable_render_buffer","");
  bVar2 = eglu::hasExtension(egl,display,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_88 = 0x100400003033;
    uStack_80 = 0x400003040;
    local_a8.field_2._M_allocated_capacity = 0x800003022;
    local_a8.field_2._8_8_ = 0x800003021;
    local_a8._M_dataplus._M_p = (pointer)0x800003024;
    local_a8._M_string_length = 0x800003023;
    local_78 = 0x3038;
    local_68[8] = 0x3033;
    local_68[9] = 4;
    local_68[10] = 0x3040;
    local_68[0xb] = 4;
    local_68[4] = 0x3022;
    local_68[5] = 8;
    local_68[6] = 0x3021;
    local_68[7] = 8;
    local_68[0] = 0x3024;
    local_68[1] = 8;
    local_68[2] = 0x3023;
    local_68[3] = 8;
    local_68[0xc] = 0x3038;
    if (this->m_enableConfigBit == true) {
      pvVar5 = eglu::chooseSingleConfig(egl,this->m_eglDisplay,(EGLint *)&local_a8);
      this->m_eglConfig = pvVar5;
    }
    else {
      eglu::chooseConfigs(&local_c8,egl,this->m_eglDisplay,local_68);
      ppvVar8 = local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)CONCAT44(local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            (Visibility)
                            local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_finish)) {
        do {
          (*egl->_vptr_Library[0x19])(egl,this->m_eglDisplay,*ppvVar8,0x3033);
          dVar4 = (*egl->_vptr_Library[0x1f])(egl);
          eglu::checkError(dVar4,
                           "getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                           ,0x88);
          ppvVar8 = ppvVar8 + 1;
        } while (ppvVar8 !=
                 (pointer)CONCAT44(local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (Visibility)
                                   local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish));
      }
      if (this->m_eglConfig == (EGLConfig)0x0) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"No config without support for mutable_render_buffer found",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0x92);
        __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      if (local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    pNVar6 = eglu::selectNativeWindowFactory
                       (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine)
    ;
    local_b0 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    pvVar5 = this->m_eglConfig;
    local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ =
         eglu::parseWindowVisibility
                   (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1e0000001e0;
    iVar3 = (*(pNVar6->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar6,pNVar1,local_b0,pvVar5,0,&local_c8);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
    pvVar7 = eglu::createWindowSurface
                       ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                        super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                        .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar3),this->m_eglDisplay,
                        this->m_eglConfig,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar7;
    local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x200003098;
    local_c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0x3038;
    (**egl->_vptr_Library)(egl,0x30a0);
    iVar3 = (*egl->_vptr_Library[6])(egl,this->m_eglDisplay,this->m_eglConfig,0,&local_c8);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar3);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar4,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,0xa4);
    pvVar7 = this->m_eglSurface;
    if (pvVar7 != (EGLSurface)0x0) {
      (*egl->_vptr_Library[0x27])(egl,this->m_eglDisplay,pvVar7,pvVar7,this->m_eglContext);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0xa7);
      EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
      return extraout_EAX;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
               ,0xa5);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"EGL_KHR_mutable_render_buffer is not supported",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
               ,100);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

void MutableRenderBufferTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// create display
	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_mutable_render_buffer"))
	{
		TCU_THROW(NotSupportedError, "EGL_KHR_mutable_render_buffer is not supported");
	}

	// get mutable render buffer config
	const EGLint	attribs[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT | EGL_MUTABLE_RENDER_BUFFER_BIT_KHR,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};
	const EGLint	attribsNoBit[]	=
	{
        EGL_RED_SIZE,			8,
        EGL_GREEN_SIZE,			8,
        EGL_BLUE_SIZE,			8,
		EGL_ALPHA_SIZE,			8,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_NONE
	};

	if (m_enableConfigBit)
	{
		m_eglConfig = eglu::chooseSingleConfig(egl, m_eglDisplay, attribs);
	}
	else
	{
		const vector<EGLConfig> configs = eglu::chooseConfigs(egl, m_eglDisplay, attribsNoBit);

		for (vector<EGLConfig>::const_iterator config = configs.begin(); config != configs.end(); ++config)
		{
			EGLint surfaceType = -1;
			EGLU_CHECK_CALL(egl, getConfigAttrib(m_eglDisplay, *config, EGL_SURFACE_TYPE, &surfaceType));

			if (!(surfaceType & EGL_MUTABLE_RENDER_BUFFER_BIT_KHR))
			{
				m_eglConfig = *config;
				break;
			}
		}

		if (m_eglConfig == DE_NULL)
			TCU_THROW(NotSupportedError, "No config without support for mutable_render_buffer found");
	}

	// create surface
	const eglu::NativeWindowFactory& factory = eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
	m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
									eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
	m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);

	// create context and make current
	const EGLint	contextAttribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	egl.bindAPI(EGL_OPENGL_ES_API);
	m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext");
	TCU_CHECK(m_eglSurface != EGL_NO_SURFACE);
	egl.makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));
}